

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.hpp
# Opt level: O0

void __thiscall cpptrace::lazy_exception::~lazy_exception(lazy_exception *this)

{
  lazy_exception *this_local;
  
  this->super_exception = (exception)&PTR__lazy_exception_002d5698;
  std::__cxx11::string::~string((string *)&this->what_string);
  cpptrace::detail::lazy_trace_holder::~lazy_trace_holder(&this->trace_holder);
  exception::~exception(&this->super_exception);
  return;
}

Assistant:

class CPPTRACE_EXPORT lazy_exception : public exception {
        mutable detail::lazy_trace_holder trace_holder;
        mutable std::string what_string;

    public:
        explicit lazy_exception(
            raw_trace&& trace = detail::get_raw_trace_and_absorb()
        ) : trace_holder(std::move(trace)) {}
        // std::exception
        const char* what() const noexcept override;
        // cpptrace::exception
        const char* message() const noexcept override;
        const stacktrace& trace() const noexcept override;
    }